

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

qint64 __thiscall QDateTime::msecsTo(QDateTime *this,QDateTime *other)

{
  bool bVar1;
  qint64 qVar2;
  qint64 qVar3;
  QDateTime *in_RDI;
  QDateTime *in_stack_00000008;
  long local_8;
  
  bVar1 = isValid(in_RDI);
  if ((bVar1) && (bVar1 = isValid(in_RDI), bVar1)) {
    qVar2 = toMSecsSinceEpoch(in_stack_00000008);
    qVar3 = toMSecsSinceEpoch(in_stack_00000008);
    local_8 = qVar2 - qVar3;
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

qint64 QDateTime::msecsTo(const QDateTime &other) const
{
    if (!isValid() || !other.isValid())
        return 0;

    return other.toMSecsSinceEpoch() - toMSecsSinceEpoch();
}